

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

void nite::graphicsRender(void)

{
  GLint GVar1;
  uint64_t uVar2;
  pointer ppRVar3;
  undefined8 *puVar4;
  long *plVar5;
  pointer pPVar6;
  long *plVar7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  ulong uVar10;
  _Hash_node_base *p_Var11;
  int c;
  long lVar12;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  float local_a4;
  float local_a0;
  float local_9c;
  long *local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  undefined1 local_58 [8];
  GLfloat Box [8];
  
  uVar2 = getTicks();
  currentDelta = uVar2 - initDelta;
  initDelta = getTicks();
  glClear(0x4000);
  glClearColor(0x3f451eb8,0x3f451eb8,0x3f451eb8,0x3f800000);
  lVar12 = 0;
  do {
    if (targets[lVar12].objects.
        super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        targets[lVar12].objects.
        super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      (*__glewBindFramebuffer)(0x8ca9,targets[lVar12].objectId);
      glClear(0x4000);
      glClearColor(0,0,0,0);
      glViewport(0,0,(int)(::size.x * targetExcess),(int)(targetExcess * ::size.y));
      glMatrixMode(0x1701);
      glLoadIdentity();
      glOrtho(0);
      glMatrixMode(0x1700);
      glLoadIdentity();
      ppRVar3 = targets[lVar12].objects.
                super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (targets[lVar12].objects.
          super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppRVar3) {
        uVar10 = 0;
        do {
          (*ppRVar3[uVar10]->function)(ppRVar3[uVar10]);
          uVar10 = uVar10 + 1;
          ppRVar3 = targets[lVar12].objects.
                    super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)targets[lVar12].objects.
                                        super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar3
                                 >> 3));
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xc);
  lVar12 = 0;
  (*__glewBindFramebuffer)(0x8ca9,0);
  glClear(0x4000);
  glClearColor(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  do {
    if (targets[lVar12].objects.
        super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        targets[lVar12].objects.
        super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      cInterp(&targets[lVar12].realZoom,targets[lVar12].Zoom,0.1);
      cInterp(&targets[lVar12].realAngle,targets[lVar12].angle,0.15);
      glColor4f(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      glEnable(0xde1);
      glPushMatrix();
      fVar14 = ::size.y;
      fVar15 = ::size.x;
      local_9c = targets[lVar12].realZoom;
      local_a0 = ::size.x * targetExcess;
      local_a4 = targetExcess * ::size.y;
      glTranslatef((0.0 - (local_a0 - ::size.x) * 0.5) + ::size.x,local_a4 * 0.5,0);
      glRotatef(targets[lVar12].realAngle,0,0,0x3f800000);
      pPVar6 = targets[lVar12].programs.
               super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (targets[lVar12].programs.super__Vector_base<nite::Program,_std::allocator<nite::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish != pPVar6) {
        uVar10 = 0;
        do {
          (*__glewUseProgram)(pPVar6[uVar10].id);
          pPVar6 = targets[lVar12].programs.
                   super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                   super__Vector_impl_data._M_start;
          p_Var11 = pPVar6[uVar10].uniforms.colors._M_h._M_before_begin._M_nxt;
          if (p_Var11 != (_Hash_node_base *)0x0) {
            do {
              GVar1 = (*__glewGetUniformLocation)
                                (targets[lVar12].programs.
                                 super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar10].id,
                                 (GLchar *)p_Var11[1]._M_nxt);
              if (GVar1 == -1) {
                pPVar6 = targets[lVar12].programs.
                         super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((pPVar6[uVar10].ref)->faulty == false) {
                  std::operator+(&local_c8,"\'",&pPVar6[uVar10].shaderName);
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
                  local_78 = &local_68;
                  plVar7 = plVar5 + 2;
                  if ((long *)*plVar5 == plVar7) {
                    local_68 = *plVar7;
                    lStack_60 = plVar5[3];
                  }
                  else {
                    local_68 = *plVar7;
                    local_78 = (long *)*plVar5;
                  }
                  local_70 = plVar5[1];
                  *plVar5 = (long)plVar7;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_78,(ulong)p_Var11[1]._M_nxt);
                  local_98 = &local_88;
                  plVar7 = plVar5 + 2;
                  if ((long *)*plVar5 == plVar7) {
                    local_88 = *plVar7;
                    lStack_80 = plVar5[3];
                  }
                  else {
                    local_88 = *plVar7;
                    local_98 = (long *)*plVar5;
                  }
                  lStack_90 = plVar5[1];
                  *plVar5 = (long)plVar7;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
                  local_58 = (undefined1  [8])(Box + 2);
                  p_Var8 = (_Hash_node_base *)(plVar5 + 2);
                  if ((_Hash_node_base *)*plVar5 == p_Var8) {
                    Box._8_8_ = p_Var8->_M_nxt;
                    Box._16_8_ = plVar5[3];
                  }
                  else {
                    Box._8_8_ = p_Var8->_M_nxt;
                    local_58 = (undefined1  [8])*plVar5;
                  }
                  Box._0_8_ = plVar5[1];
                  *plVar5 = (long)p_Var8;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  print((string *)local_58);
                  if (local_58 != (undefined1  [8])(Box + 2)) {
                    operator_delete((void *)local_58);
                  }
                  if (local_98 != &local_88) {
                    operator_delete(local_98);
                  }
                  if (local_78 != &local_68) {
                    operator_delete(local_78);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p);
                  }
                  (targets[lVar12].programs.
                   super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10].ref)->faulty = true;
                }
              }
              else {
                local_58 = (undefined1  [8])p_Var11[5]._M_nxt;
                Box[0] = *(GLfloat *)&p_Var11[6]._M_nxt;
                (*__glewUniform3fv)(GVar1,1,(GLfloat *)local_58);
              }
              p_Var11 = p_Var11->_M_nxt;
            } while (p_Var11 != (_Hash_node_base *)0x0);
            pPVar6 = targets[lVar12].programs.
                     super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          p_Var11 = pPVar6[uVar10].uniforms.integers._M_h._M_before_begin._M_nxt;
          if (p_Var11 != (_Hash_node_base *)0x0) {
            do {
              GVar1 = (*__glewGetUniformLocation)
                                (targets[lVar12].programs.
                                 super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar10].id,
                                 (GLchar *)p_Var11[1]._M_nxt);
              if (GVar1 == -1) {
                pPVar6 = targets[lVar12].programs.
                         super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((pPVar6[uVar10].ref)->faulty == false) {
                  std::operator+(&local_c8,"\'",&pPVar6[uVar10].shaderName);
                  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
                  local_78 = &local_68;
                  plVar5 = puVar4 + 2;
                  if ((long *)*puVar4 == plVar5) {
                    local_68 = *plVar5;
                    lStack_60 = puVar4[3];
                  }
                  else {
                    local_68 = *plVar5;
                    local_78 = (long *)*puVar4;
                  }
                  local_70 = puVar4[1];
                  *puVar4 = plVar5;
                  puVar4[1] = 0;
                  *(undefined1 *)(puVar4 + 2) = 0;
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_78,(ulong)p_Var11[1]._M_nxt);
                  local_98 = &local_88;
                  plVar5 = puVar4 + 2;
                  if ((long *)*puVar4 == plVar5) {
                    local_88 = *plVar5;
                    lStack_80 = puVar4[3];
                  }
                  else {
                    local_88 = *plVar5;
                    local_98 = (long *)*puVar4;
                  }
                  lStack_90 = puVar4[1];
                  *puVar4 = plVar5;
                  puVar4[1] = 0;
                  *(undefined1 *)(puVar4 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
                  local_58 = (undefined1  [8])(Box + 2);
                  p_Var8 = (_Hash_node_base *)(plVar5 + 2);
                  if ((_Hash_node_base *)*plVar5 == p_Var8) {
                    Box._8_8_ = p_Var8->_M_nxt;
                    Box._16_8_ = plVar5[3];
                  }
                  else {
                    Box._8_8_ = p_Var8->_M_nxt;
                    local_58 = (undefined1  [8])*plVar5;
                  }
                  Box._0_8_ = plVar5[1];
                  *plVar5 = (long)p_Var8;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  print((string *)local_58);
                  if (local_58 != (undefined1  [8])(Box + 2)) {
                    operator_delete((void *)local_58);
                  }
                  if (local_98 != &local_88) {
                    operator_delete(local_98);
                  }
                  if (local_78 != &local_68) {
                    operator_delete(local_78);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p);
                  }
                  (targets[lVar12].programs.
                   super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10].ref)->faulty = true;
                }
              }
              else {
                (*__glewUniform1i)(GVar1,*(GLint *)&p_Var11[5]._M_nxt);
              }
              p_Var11 = p_Var11->_M_nxt;
            } while (p_Var11 != (_Hash_node_base *)0x0);
            pPVar6 = targets[lVar12].programs.
                     super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          p_Var11 = pPVar6[uVar10].uniforms.floats._M_h._M_before_begin._M_nxt;
          if (p_Var11 != (_Hash_node_base *)0x0) {
            do {
              GVar1 = (*__glewGetUniformLocation)
                                (targets[lVar12].programs.
                                 super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar10].id,
                                 (GLchar *)p_Var11[1]._M_nxt);
              if (GVar1 == -1) {
                pPVar6 = targets[lVar12].programs.
                         super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((pPVar6[uVar10].ref)->faulty == false) {
                  std::operator+(&local_c8,"\'",&pPVar6[uVar10].shaderName);
                  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
                  local_78 = &local_68;
                  plVar5 = puVar4 + 2;
                  if ((long *)*puVar4 == plVar5) {
                    local_68 = *plVar5;
                    lStack_60 = puVar4[3];
                  }
                  else {
                    local_68 = *plVar5;
                    local_78 = (long *)*puVar4;
                  }
                  local_70 = puVar4[1];
                  *puVar4 = plVar5;
                  puVar4[1] = 0;
                  *(undefined1 *)(puVar4 + 2) = 0;
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_78,(ulong)p_Var11[1]._M_nxt);
                  local_98 = &local_88;
                  plVar5 = puVar4 + 2;
                  if ((long *)*puVar4 == plVar5) {
                    local_88 = *plVar5;
                    lStack_80 = puVar4[3];
                  }
                  else {
                    local_88 = *plVar5;
                    local_98 = (long *)*puVar4;
                  }
                  lStack_90 = puVar4[1];
                  *puVar4 = plVar5;
                  puVar4[1] = 0;
                  *(undefined1 *)(puVar4 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
                  local_58 = (undefined1  [8])(Box + 2);
                  p_Var8 = (_Hash_node_base *)(plVar5 + 2);
                  if ((_Hash_node_base *)*plVar5 == p_Var8) {
                    Box._8_8_ = p_Var8->_M_nxt;
                    Box._16_8_ = plVar5[3];
                  }
                  else {
                    Box._8_8_ = p_Var8->_M_nxt;
                    local_58 = (undefined1  [8])*plVar5;
                  }
                  Box._0_8_ = plVar5[1];
                  *plVar5 = (long)p_Var8;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  print((string *)local_58);
                  if (local_58 != (undefined1  [8])(Box + 2)) {
                    operator_delete((void *)local_58);
                  }
                  if (local_98 != &local_88) {
                    operator_delete(local_98);
                  }
                  if (local_78 != &local_68) {
                    operator_delete(local_78);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p);
                  }
                  (targets[lVar12].programs.
                   super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10].ref)->faulty = true;
                }
              }
              else {
                (*__glewUniform1f)(GVar1,*(GLfloat *)&p_Var11[5]._M_nxt);
              }
              p_Var11 = p_Var11->_M_nxt;
            } while (p_Var11 != (_Hash_node_base *)0x0);
            pPVar6 = targets[lVar12].programs.
                     super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          p_Var11 = pPVar6[uVar10].uniforms.vectors._M_h._M_before_begin._M_nxt;
          if (p_Var11 != (_Hash_node_base *)0x0) {
            do {
              GVar1 = (*__glewGetUniformLocation)
                                (targets[lVar12].programs.
                                 super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar10].id,
                                 (GLchar *)p_Var11[1]._M_nxt);
              if (GVar1 == -1) {
                pPVar6 = targets[lVar12].programs.
                         super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((pPVar6[uVar10].ref)->faulty == false) {
                  std::operator+(&local_c8,"\'",&pPVar6[uVar10].shaderName);
                  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
                  local_78 = &local_68;
                  plVar5 = puVar4 + 2;
                  if ((long *)*puVar4 == plVar5) {
                    local_68 = *plVar5;
                    lStack_60 = puVar4[3];
                  }
                  else {
                    local_68 = *plVar5;
                    local_78 = (long *)*puVar4;
                  }
                  local_70 = puVar4[1];
                  *puVar4 = plVar5;
                  puVar4[1] = 0;
                  *(undefined1 *)(puVar4 + 2) = 0;
                  puVar4 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_78,(ulong)p_Var11[1]._M_nxt);
                  local_98 = &local_88;
                  plVar5 = puVar4 + 2;
                  if ((long *)*puVar4 == plVar5) {
                    local_88 = *plVar5;
                    lStack_80 = puVar4[3];
                  }
                  else {
                    local_88 = *plVar5;
                    local_98 = (long *)*puVar4;
                  }
                  lStack_90 = puVar4[1];
                  *puVar4 = plVar5;
                  puVar4[1] = 0;
                  *(undefined1 *)(puVar4 + 2) = 0;
                  plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
                  local_58 = (undefined1  [8])(Box + 2);
                  p_Var8 = (_Hash_node_base *)(plVar5 + 2);
                  if ((_Hash_node_base *)*plVar5 == p_Var8) {
                    Box._8_8_ = p_Var8->_M_nxt;
                    Box._16_8_ = plVar5[3];
                  }
                  else {
                    Box._8_8_ = p_Var8->_M_nxt;
                    local_58 = (undefined1  [8])*plVar5;
                  }
                  Box._0_8_ = plVar5[1];
                  *plVar5 = (long)p_Var8;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  print((string *)local_58);
                  if (local_58 != (undefined1  [8])(Box + 2)) {
                    operator_delete((void *)local_58);
                  }
                  if (local_98 != &local_88) {
                    operator_delete(local_98);
                  }
                  if (local_78 != &local_68) {
                    operator_delete(local_78);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p);
                  }
                  (targets[lVar12].programs.
                   super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10].ref)->faulty = true;
                }
              }
              else {
                local_58 = (undefined1  [8])p_Var11[5]._M_nxt;
                (*__glewUniform2fv)(GVar1,1,(GLfloat *)local_58);
              }
              p_Var11 = p_Var11->_M_nxt;
            } while (p_Var11 != (_Hash_node_base *)0x0);
            pPVar6 = targets[lVar12].programs.
                     super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          uVar10 = uVar10 + 1;
          uVar9 = ((long)targets[lVar12].programs.
                         super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pPVar6 >> 4) *
                  -0x79435e50d79435e5;
        } while (uVar10 <= uVar9 && uVar9 - uVar10 != 0);
      }
      local_9c = local_9c / 100.0;
      glBindTexture(0xde1,targets[lVar12].texture);
      uVar13 = 0x46180400;
      if (targets[lVar12].smooth == false) {
        uVar13 = 0x46180000;
      }
      glTexParameterf(uVar13,0xde1,0x2800);
      uVar13 = 0x46180400;
      if (targets[lVar12].smooth == false) {
        uVar13 = 0x46180000;
      }
      fVar14 = fVar14 * local_9c + fVar14 * -0.5;
      fVar15 = fVar15 * local_9c;
      local_a4 = local_a4 * local_9c;
      local_a0 = local_a0 * local_9c;
      glTexParameterf(uVar13,0xde1,0x2801);
      local_58 = (undefined1  [8])(CONCAT44(fVar14,fVar15) ^ 0x8000000080000000);
      Box._0_8_ = CONCAT44(fVar14,local_a0 - fVar15) ^ 0x8000000000000000;
      Box[3] = local_a4 - fVar14;
      Box[2] = local_a0 - fVar15;
      Box._16_8_ = CONCAT44(local_a4 - fVar14,fVar15) ^ 0x80000000;
      local_88 = 0x3f800000;
      lStack_80 = 0;
      local_98 = (long *)0x3f80000000000000;
      lStack_90 = 0x3f8000003f800000;
      glEnableClientState(0x8078);
      glEnableClientState(0x8074);
      glVertexPointer(2,0x1406,0,local_58);
      glTexCoordPointer(2,0x1406,0,&local_98);
      glDrawArrays(7,0,4);
      glDisableClientState(0x8078);
      glDisableClientState(0x8074);
      glBindTexture(0xde1);
      glPopMatrix();
      glDisable();
      (*__glewUseProgram)(0);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xc);
  lVar12 = 0;
  do {
    if (*(long *)((long)&targets[0].objects.
                         super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar12) !=
        *(long *)((long)&targets[0].objects.
                         super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12)) {
      RenderTarget::clear((RenderTarget *)
                          ((long)&targets[0].objects.
                                  super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar12));
    }
    lVar12 = lVar12 + 0x50;
  } while (lVar12 != 0x3c0);
  depth = 0;
  flushTexture();
  flushFont();
  SDL_GL_SwapWindow(Window);
  Console::render();
  UI::render();
  return;
}

Assistant:

void nite::graphicsRender(){

  	currentDelta = nite::getTicks() - initDelta;
	initDelta = nite::getTicks();

	if(cl_showfps){
		// UInt64 time = nite::getTicks()-lastFrameTick;
		// lastFrameTick = nite::getTicks();
		// String text = "delta "+nite::toStr((size_t)time)+" ms";
		// int w = debugFont.getWidth("delta 1000 ms");
		// nite::setRenderTarget(nite::RenderTargetPosterioriEngine);
		// nite::setColor(time < 16 ? nite::Color(1.0f, 0.0f, 0.0f, 1.0f) : nite::Color(0.0f, 1.0f, 0.0f, 1.0f));
		// debugFont.draw(text, nite::getWidth()-w * 2.0f, 0.0f + debugFont.getHeight());
	}

	glClear(GL_COLOR_BUFFER_BIT);
	glClearColor(0.77, 0.77, 0.77, 1.0);
	for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, targets[c].objectId);
		setupTarget();
		for(int i = 0; i < targets[c].objects.size(); ++i){
			targets[c].objects[i]->function(targets[c].objects[i]);
		}
	}
	glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);

	glClear(GL_COLOR_BUFFER_BIT);
	glClearColor (1, 1, 1, 1);

	for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		drawTarget(targets[c]);
	}

	for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		targets[c].clear();
	}

	nite::setDepth(0);
	flushTexture();
	flushFont();
	SDL_GL_SwapWindow(Window);

	nite::Console::render();
	nite::UI::render();	
}